

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostkey.c
# Opt level: O0

int hostkey_method_ssh_rsa_signv
              (LIBSSH2_SESSION *session,uchar **signature,size_t *signature_len,int veccount,
              iovec *datavec,void **abstract)

{
  RSA *rsactx_00;
  int iVar1;
  EVP_MD_CTX *local_70;
  EVP_MD_CTX *ctx;
  uchar hash [20];
  int i;
  int ret;
  RSA *rsactx;
  void **abstract_local;
  iovec *datavec_local;
  int veccount_local;
  size_t *signature_len_local;
  uchar **signature_local;
  LIBSSH2_SESSION *session_local;
  
  rsactx_00 = (RSA *)*abstract;
  _libssh2_sha1_init((EVP_MD_CTX **)&local_70);
  hash[0x10] = '\0';
  hash[0x11] = '\0';
  hash[0x12] = '\0';
  hash[0x13] = '\0';
  for (; (int)hash._16_4_ < veccount; hash._16_4_ = hash._16_4_ + 1) {
    EVP_DigestUpdate(local_70,datavec[(int)hash._16_4_].iov_base,datavec[(int)hash._16_4_].iov_len);
  }
  EVP_DigestFinal(local_70,(uchar *)&ctx,(uint *)0x0);
  EVP_MD_CTX_free(local_70);
  iVar1 = _libssh2_rsa_sha1_sign(session,rsactx_00,(uchar *)&ctx,0x14,signature,signature_len);
  if (iVar1 == 0) {
    session_local._4_4_ = 0;
  }
  else {
    session_local._4_4_ = -1;
  }
  return session_local._4_4_;
}

Assistant:

static int
hostkey_method_ssh_rsa_signv(LIBSSH2_SESSION * session,
                             unsigned char **signature,
                             size_t *signature_len,
                             int veccount,
                             const struct iovec datavec[],
                             void **abstract)
{
    libssh2_rsa_ctx *rsactx = (libssh2_rsa_ctx *) (*abstract);

#ifdef _libssh2_rsa_sha1_signv
    return _libssh2_rsa_sha1_signv(session, signature, signature_len,
                                   veccount, datavec, rsactx);
#else
    int ret;
    int i;
    unsigned char hash[SHA_DIGEST_LENGTH];
    libssh2_sha1_ctx ctx;

    (void)libssh2_sha1_init(&ctx);
    for(i = 0; i < veccount; i++) {
        libssh2_sha1_update(ctx, datavec[i].iov_base, datavec[i].iov_len);
    }
    libssh2_sha1_final(ctx, hash);

    ret = _libssh2_rsa_sha1_sign(session, rsactx, hash, SHA_DIGEST_LENGTH,
                                 signature, signature_len);
    if(ret) {
        return -1;
    }

    return 0;
#endif
}